

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O1

spv_result_t spvtools::val::MemoryPass(ValidationState_t *_,Instruction *inst)

{
  CapabilitySet *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  short sVar5;
  pointer puVar6;
  undefined4 id;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  AddressingModel AVar13;
  uint uVar14;
  spv_result_t sVar15;
  spv_result_t sVar16;
  uint32_t uVar17;
  uint uVar18;
  TensorAddressingOperandsMask TVar19;
  StorageClass SVar20;
  int32_t iVar21;
  StorageClass SVar22;
  spv_result_t sVar23;
  Instruction *pIVar24;
  long *plVar25;
  undefined8 *puVar26;
  Instruction *pIVar27;
  Instruction *pIVar28;
  Instruction *this_00;
  _Any_data *p_Var29;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 extraout_var;
  DiagnosticStream *pDVar30;
  Function *this_01;
  _Any_data **pp_Var31;
  ulong uVar32;
  byte bVar33;
  uint32_t uVar34;
  long lVar35;
  ulong uVar36;
  int iVar37;
  __buckets_ptr index;
  bool bVar38;
  char *pcVar39;
  string *val;
  undefined8 uVar40;
  size_t sVar41;
  byte bVar42;
  undefined8 uVar43;
  char *operand_name;
  Op opcode;
  ValidationState_t *pVVar44;
  tuple<bool,_bool,_unsigned_int> inc_eval;
  uint64_t layout;
  char *opcode_name;
  tuple<bool,_bool,_unsigned_int> m_eval;
  tuple<bool,_bool,_unsigned_int> rc_eval;
  tuple<bool,_bool,_unsigned_int> k_eval;
  string errorVUID;
  tuple<bool,_bool,_unsigned_int> input_interp_eval;
  _Any_data local_2d8;
  _Any_data *local_2c8;
  code *pcStack_2c0;
  string local_2b8;
  Instruction *local_298;
  uint local_290;
  uint local_28c;
  Instruction *local_288;
  _Any_data local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  bool local_25c;
  undefined3 uStack_25b;
  _Tuple_impl<1UL,_bool,_unsigned_int> local_258;
  uint local_250;
  uint local_24c;
  tuple<bool,_bool,_unsigned_int> local_248;
  ulong local_240;
  size_t local_238;
  undefined8 local_230;
  uint local_224;
  tuple<bool,_bool,_unsigned_int> local_220;
  _Any_data local_218;
  undefined1 local_208 [464];
  tuple<bool,_bool,_unsigned_int> local_38;
  
  uVar2 = *(ushort *)
           ((long)&(inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2);
  opcode = (Op)uVar2;
  if (0x1168 < uVar2) {
    if (0x14ee < uVar2) {
      if (uVar2 < 0x14f7) {
        if (1 < uVar2 - 0x14ef) {
          if (opcode == OpCooperativeMatrixLengthNV) goto LAB_00690eb1;
          goto switchD_006909d1_caseD_3c;
        }
        if (opcode == OpCooperativeMatrixLoadNV) {
          local_2b8._M_dataplus._M_p = "spv::Op::OpCooperativeMatrixLoadNV";
          pIVar24 = (Instruction *)inst;
        }
        else {
          uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
          pIVar24 = ValidationState_t::FindDef(_,uVar14);
          local_2b8._M_dataplus._M_p = "spv::Op::OpCooperativeMatrixStoreNV";
        }
        uVar17 = (pIVar24->inst_).type_id;
        pIVar24 = ValidationState_t::FindDef(_,uVar17);
        sVar5 = *(short *)((long)&(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 2);
        if ((pIVar24->inst_).opcode != 0x14ee) {
          if (sVar5 != 0x14ef) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pcVar39 = "spv::Op::OpCooperativeMatrixStoreNV Object type <id> ";
            goto LAB_00691fef;
          }
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar39 = "spv::Op::OpCooperativeMatrixLoadNV Result Type <id> ";
          lVar35 = 0x34;
          goto LAB_0069201a;
        }
        sVar16 = Instruction::GetOperandAs<unsigned_int>
                           ((Instruction *)inst,(ulong)((uint)(sVar5 == 0x14ef) * 2));
        pIVar24 = ValidationState_t::FindDef(_,sVar16);
        if ((pIVar24 == (Instruction *)0x0) ||
           ((AVar13 = ValidationState_t::addressing_model(_), AVar13 == AddressingModelLogical &&
            ((((_->features_).variable_pointers == false &&
              (iVar21 = spvOpcodeReturnsLogicalPointer((uint)(pIVar24->inst_).opcode), iVar21 == 0))
             || (((_->features_).variable_pointers == true &&
                 (bVar11 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar24->inst_).opcode),
                 !bVar11)))))))) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          val = &local_2b8;
          goto LAB_00692775;
        }
        uVar17 = (pIVar24->inst_).type_id;
        pIVar27 = ValidationState_t::FindDef(_,uVar17);
        if ((pIVar27 != (Instruction *)0x0) && ((pIVar27->inst_).opcode == 0x20)) {
          SVar22 = Instruction::GetOperandAs<spv::StorageClass>(pIVar27,1);
          if ((SVar22 == StorageClassWorkgroup) ||
             ((SVar22 == StorageBuffer || (SVar22 == PhysicalStorageBuffer)))) {
            uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
            pIVar27 = ValidationState_t::FindDef(_,uVar14);
            if ((pIVar27 == (Instruction *)0x0) ||
               ((bVar11 = ValidationState_t::IsIntScalarOrVectorType(_,uVar14), !bVar11 &&
                (bVar11 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar14), !bVar11)))) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              p_Var29 = (_Any_data *)
                        DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)&local_2b8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)p_Var29->_M_pod_data," Pointer <id> ",0xe);
              ValidationState_t::getIdName_abi_cxx11_
                        ((string *)&local_2d8,_,(pIVar24->inst_).result_id);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)p_Var29->_M_pod_data,(char *)local_2d8._M_unused._0_8_,
                         local_2d8._8_8_);
              pcVar39 = "s Type must be a scalar or vector type.";
              lVar35 = 0x27;
            }
            else {
              uVar14 = Instruction::GetOperandAs<unsigned_int>
                                 ((Instruction *)inst,
                                  (ulong)(*(short *)((long)&(inst->operands_).
                                                                                                                        
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2) ==
                                         0x14ef) | 2);
              pIVar24 = ValidationState_t::FindDef(_,uVar14);
              if ((pIVar24 == (Instruction *)0x0) ||
                 (bVar11 = ValidationState_t::IsIntScalarType(_,(pIVar24->inst_).type_id), !bVar11))
              {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,"Stride operand <id> ",0x14);
                ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar14);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                           local_2d8._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data," must be a scalar integer type.",0x1f);
                goto LAB_00692aab;
              }
              uVar14 = Instruction::GetOperandAs<unsigned_int>
                                 ((Instruction *)inst,
                                  (ulong)(*(short *)((long)&(inst->operands_).
                                                                                                                        
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2) ==
                                         0x14ef) + 3);
              pIVar24 = ValidationState_t::FindDef(_,uVar14);
              if (((pIVar24 != (Instruction *)0x0) &&
                  (bVar11 = ValidationState_t::IsBoolScalarType(_,(pIVar24->inst_).type_id), bVar11)
                  ) && ((iVar21 = spvOpcodeIsConstant((uint)(pIVar24->inst_).opcode), iVar21 != 0 ||
                        (iVar21 = spvOpcodeIsSpecConstant((uint)(pIVar24->inst_).opcode),
                        iVar21 != 0)))) {
                uVar14 = *(short *)((long)&(inst->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14ef
                         | 4;
                if (((ulong)((long)inst->context_ -
                             *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                       is_sentinel_ >> 4) <= (ulong)uVar14) ||
                   (sVar15 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar14), sVar15 == SPV_SUCCESS
                   )) goto LAB_00692e1b;
                goto LAB_00692aca;
              }
              p_Var29 = &local_218;
              ValidationState_t::diag
                        ((DiagnosticStream *)p_Var29,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)p_Var29->_M_pod_data,"Column Major operand <id> ",0x1a);
              ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar14);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)p_Var29->_M_pod_data,(char *)local_2d8._M_unused._0_8_,
                         local_2d8._8_8_);
              pcVar39 = " must be a boolean constant instruction.";
              lVar35 = 0x28;
            }
          }
          else {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            p_Var29 = (_Any_data *)
                      DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)&local_2b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)p_Var29->_M_pod_data," storage class for pointer type <id> ",0x25)
            ;
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)p_Var29->_M_pod_data,(char *)local_2d8._M_unused._0_8_,
                       local_2d8._8_8_);
            pcVar39 = " is not Workgroup or StorageBuffer.";
            lVar35 = 0x23;
          }
          goto LAB_00692a94;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        p_Var29 = (_Any_data *)
                  DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_2b8);
        pcVar39 = " type for pointer <id> ";
        lVar35 = 0x17;
LAB_006923b8:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)p_Var29->_M_pod_data,pcVar39,lVar35);
LAB_006924a6:
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,sVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)p_Var29->_M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_
                  );
        pcVar39 = " is not a pointer type.";
        lVar35 = 0x17;
        goto LAB_00692a94;
      }
      if (1 < uVar2 - 0x14f7) {
        if (opcode != OpRawAccessChainNV) goto switchD_006909d1_caseD_3c;
        local_280._M_unused._M_object = inst;
        pcVar39 = spvOpcodeString(OpRawAccessChainNV);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_218._M_pod_data,pcVar39,(allocator<char> *)&local_2b8);
        puVar26 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x7c6340);
        local_2d8._M_unused._M_object = &local_2c8;
        pp_Var31 = (_Any_data **)(puVar26 + 2);
        if ((_Any_data **)*puVar26 == pp_Var31) {
          local_2c8 = *pp_Var31;
          pcStack_2c0 = (code *)puVar26[3];
        }
        else {
          local_2c8 = *pp_Var31;
          local_2d8._M_unused._M_object = (_Any_data **)*puVar26;
        }
        local_2d8._8_8_ = puVar26[1];
        *puVar26 = pp_Var31;
        puVar26[1] = 0;
        *(undefined1 *)(puVar26 + 2) = 0;
        if ((ValidationState_t *)local_218._M_unused._0_8_ != (ValidationState_t *)local_208) {
          operator_delete(local_218._M_unused._M_object,(ulong)(local_208._0_8_ + 1));
        }
        pIVar24 = ValidationState_t::FindDef
                            (_,*(uint32_t *)(local_280._M_unused._M_function_pointer + 0x40));
        if ((pIVar24->inst_).opcode != 0x20) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                     (Instruction *)local_280._M_unused._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                     local_2d8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_
                    (&local_2b8,_,*(uint32_t *)(local_280._M_unused._M_function_pointer + 0x44));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," must be OpTypePointer. Found Op",0x20);
          local_258 = (_Tuple_impl<1UL,_bool,_unsigned_int>)
                      spvOpcodeString((uint)(pIVar24->inst_).opcode);
          pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_258)
          ;
          local_248.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
          super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
          super__Head_base<2UL,_unsigned_int,_false>._M_head_impl._0_1_ = 0x2e;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30,(char *)&local_248,1);
          sVar15 = pDVar30->error_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
          goto LAB_00692bac;
        }
        SVar22 = Instruction::GetOperandAs<spv::StorageClass>(pIVar24,1);
        if (((SVar22 == StorageClassUniform) || (SVar22 == StorageBuffer)) ||
           (SVar22 == PhysicalStorageBuffer)) {
          uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,2);
          pIVar24 = ValidationState_t::FindDef(_,uVar14);
          uVar14 = (uint)(pIVar24->inst_).opcode;
          if ((uVar14 < 0x1f) && ((0x51000000U >> (uVar14 & 0x1f) & 1) != 0)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                       (Instruction *)local_280._M_unused._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                       local_2d8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      (&local_2b8,_,*(uint32_t *)(local_280._M_unused._M_function_pointer + 0x44));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                       local_2b8._M_string_length);
            pcVar39 = " must not point to OpTypeArray, OpTypeMatrix, or OpTypeStruct.";
            lVar35 = 0x3e;
            goto LAB_00692b71;
          }
          uVar14 = Instruction::GetOperandAs<unsigned_int>
                             ((Instruction *)local_280._M_unused._0_8_,3);
          pIVar24 = ValidationState_t::FindDef(_,uVar14);
          if ((pIVar24->inst_).opcode != 0x2b) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                       (Instruction *)local_280._M_unused._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The Stride of ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                       local_2d8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      (&local_2b8,_,*(uint32_t *)(local_280._M_unused._M_function_pointer + 0x44));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                       local_2b8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," must be OpConstant. Found Op",0x1d);
            local_258 = (_Tuple_impl<1UL,_bool,_unsigned_int>)
                        spvOpcodeString((uint)(pIVar24->inst_).opcode);
LAB_006946b9:
            p_Var29 = (_Any_data *)
                      DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)&local_258);
            pcVar39 = (char *)&local_248;
            local_248.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
            super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl._0_1_ = 0x2e;
            lVar35 = 1;
            goto LAB_00692b74;
          }
          pIVar27 = ValidationState_t::FindDef(_,(pIVar24->inst_).type_id);
          if ((pIVar27->inst_).opcode != 0x15) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                       (Instruction *)local_280._M_unused._0_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The type of Stride of ",0x16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                       local_2d8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      (&local_2b8,_,*(uint32_t *)(local_280._M_unused._M_function_pointer + 0x44));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                       local_2b8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," must be OpTypeInt. Found Op",0x1c);
            local_258 = (_Tuple_impl<1UL,_bool,_unsigned_int>)
                        spvOpcodeString((uint)(pIVar27->inst_).opcode);
            goto LAB_006946b9;
          }
          local_2b8._M_string_length = (size_type)&local_280;
          local_2b8.field_2._M_allocated_capacity = (size_type)&local_2d8;
          local_2b8._M_dataplus._M_p = (pointer)_;
          sVar15 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                             ((anon_class_24_3_e757d3e0 *)&local_2b8,"Index",4);
          if ((sVar15 == SPV_SUCCESS) &&
             (sVar15 = anon_unknown_2::ValidateRawAccessChain::anon_class_24_3_e757d3e0::operator()
                                 ((anon_class_24_3_e757d3e0 *)&local_2b8,"Offset",5),
             sVar15 == SPV_SUCCESS)) {
            uVar14 = 0;
            if (0x60 < (ulong)(*(long *)(local_280._M_unused._M_function_pointer + 0x20) -
                              *(long *)(local_280._M_unused._M_function_pointer + 0x18))) {
              uVar14 = Instruction::GetOperandAs<unsigned_int>
                                 ((Instruction *)local_280._M_unused._0_8_,6);
            }
            if ((uVar14 & 2) != 0) {
              local_258.super__Tuple_impl<2UL,_unsigned_int>.
              super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                   (_Head_base<2UL,_unsigned_int,_false>)0x0;
              local_258.super__Head_base<1UL,_bool,_false>._M_head_impl = false;
              local_258._5_3_ = 0;
              bVar11 = ValidationState_t::EvalConstantValUint64
                                 (_,(pIVar24->inst_).result_id,(uint64_t *)&local_258);
              if (local_258 == (_Tuple_impl<1UL,_bool,_unsigned_int>)0x0 && bVar11) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                           (Instruction *)local_280._M_unused._0_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,
                           "Stride must not be zero when per-element robustness is used.",0x3c);
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
                sVar15 = local_208._448_4_;
                goto LAB_00692bac;
              }
            }
            if ((uVar14 & 1) == 0) {
              if ((SVar22 == PhysicalStorageBuffer) && ((uVar14 & 2) != 0)) goto LAB_00695357;
LAB_0069599c:
              sVar15 = SPV_SUCCESS;
              if ((~uVar14 & 3) != 0) goto LAB_00692bac;
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                         (Instruction *)local_280._M_unused._0_8_);
              pcVar39 = 
              "Per-component robustness and per-element robustness are mutually exclusive.";
              lVar35 = 0x4b;
            }
            else {
              if (SVar22 != PhysicalStorageBuffer) goto LAB_0069599c;
LAB_00695357:
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                         (Instruction *)local_280._M_unused._0_8_);
              pcVar39 = 
              "Storage class cannot be PhysicalStorageBuffer when raw access chain robustness is used."
              ;
              lVar35 = 0x57;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,pcVar39,lVar35);
            sVar15 = local_208._448_4_;
            goto LAB_00692ba2;
          }
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                     (Instruction *)local_280._M_unused._0_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                     local_2d8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_
                    (&local_2b8,_,*(uint32_t *)(local_280._M_unused._M_function_pointer + 0x44));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          pcVar39 = 
          " must point to a storage class of StorageBuffer, PhysicalStorageBuffer, or Uniform.";
          lVar35 = 0x53;
LAB_00692b71:
          p_Var29 = &local_218;
LAB_00692b74:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)p_Var29->_M_pod_data,pcVar39,lVar35);
          sVar15 = *(spv_result_t *)(p_Var29->_M_pod_data + 0x1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
LAB_00692ba2:
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        }
LAB_00692bac:
        if ((_Any_data **)local_2d8._M_unused._0_8_ == &local_2c8) goto LAB_00692aca;
        goto LAB_00692bba;
      }
      if (opcode == OpCooperativeMatrixLoadTensorNV) {
        local_280._M_unused._M_object = "spv::Op::OpCooperativeMatrixLoadTensorNV";
        pIVar24 = (Instruction *)inst;
      }
      else {
        uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
        pIVar24 = ValidationState_t::FindDef(_,uVar14);
        local_280._M_unused._M_object = "spv::Op::OpCooperativeMatrixStoreTensorNV";
      }
      uVar17 = (pIVar24->inst_).type_id;
      pIVar24 = ValidationState_t::FindDef(_,uVar17);
      sVar5 = *(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2);
      if ((pIVar24->inst_).opcode == 0x1168) {
        sVar16 = Instruction::GetOperandAs<unsigned_int>
                           ((Instruction *)inst,(ulong)((uint)(sVar5 == 0x14f7) * 2));
        pIVar27 = ValidationState_t::FindDef(_,sVar16);
        if ((pIVar27 == (Instruction *)0x0) ||
           ((AVar13 = ValidationState_t::addressing_model(_), AVar13 == AddressingModelLogical &&
            ((((_->features_).variable_pointers == false &&
              (iVar21 = spvOpcodeReturnsLogicalPointer((uint)(pIVar27->inst_).opcode), iVar21 == 0))
             || (((_->features_).variable_pointers == true &&
                 (bVar11 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar27->inst_).opcode),
                 !bVar11)))))))) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          p_Var29 = (_Any_data *)
                    DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)p_Var29->_M_pod_data," Pointer <id> ",0xe);
          goto LAB_00692a74;
        }
        uVar34 = (pIVar27->inst_).type_id;
        pIVar27 = ValidationState_t::FindDef(_,uVar34);
        if ((pIVar27 == (Instruction *)0x0) || ((pIVar27->inst_).opcode != 0x20)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          p_Var29 = (_Any_data *)
                    DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)p_Var29->_M_pod_data," type for pointer <id> ",0x17);
          goto LAB_006924a6;
        }
        SVar22 = Instruction::GetOperandAs<spv::StorageClass>(pIVar27,1);
        if (((SVar22 != StorageClassWorkgroup) && (SVar22 != StorageBuffer)) &&
           (SVar22 != PhysicalStorageBuffer)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2d8,_,0x230d,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                     local_2d8._8_8_);
          pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30," storage class for pointer type <id> ",0x25);
LAB_006944c8:
          ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,uVar34);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30,
                     " is not Workgroup, StorageBuffer, or PhysicalStorageBuffer.",0x3b);
          local_208._448_4_ = pDVar30->error_;
          goto LAB_006944fa;
        }
        if (*(short *)((long)&(inst->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14f7) {
          uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
          pIVar27 = ValidationState_t::FindDef(_,uVar14);
          if ((pIVar27 == (Instruction *)0x0) || ((pIVar27->inst_).type_id != uVar17)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pDVar30 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)&local_280);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar30," Object <id> ",0xd);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar30,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar30," type does not match Result Type.",0x21);
            sVar16 = pDVar30->error_;
            if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
              operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
            bVar11 = false;
          }
          else {
            bVar11 = true;
          }
          sVar15 = sVar16;
          if (!bVar11) goto LAB_00692aca;
        }
        uVar14 = Instruction::GetOperandAs<unsigned_int>
                           ((Instruction *)inst,
                            (ulong)(*(short *)((long)&(inst->operands_).
                                                                                                            
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2) ==
                                   0x14f7) * 2 + 2);
        pIVar27 = ValidationState_t::FindDef(_,uVar14);
        if ((pIVar27 == (Instruction *)0x0) ||
           (pIVar28 = ValidationState_t::FindDef(_,(pIVar27->inst_).type_id),
           (pIVar28->inst_).opcode != 0x14fa)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          p_Var29 = (_Any_data *)
                    DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)p_Var29->_M_pod_data," TensorLayout <id> ",0x13);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)p_Var29->_M_pod_data,(char *)local_2d8._M_unused._0_8_,
                     local_2d8._8_8_);
          pcVar39 = " does not have a tensor layout type.";
          lVar35 = 0x24;
          goto LAB_00692a94;
        }
        uVar14 = (uint)(*(short *)((long)&(inst->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14f7)
                 * 2 + 3;
        local_288 = pIVar27;
        if (((ulong)uVar14 <
             (ulong)((long)inst->context_ -
                     *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                               is_sentinel_ >> 4)) &&
           (sVar15 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar14), sVar15 != SPV_SUCCESS))
        goto LAB_00692aca;
        uVar18 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar14);
        iVar37 = ((uVar18 >> 3 & 1) + uVar14 + (uint)((uVar18 >> 4 & 1) != 0)) -
                 (uint)((uVar18 & 2) == 0);
        TVar19 = Instruction::GetOperandAs<spv::TensorAddressingOperandsMask>
                           ((Instruction *)inst,(ulong)(iVar37 + 2U));
        if ((ulong)((long)inst->context_ -
                    *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                              is_sentinel_ >> 4) <
            (ulong)((TVar19 & TensorAddressingOperandsTensorViewMask) +
                    TensorAddressingOperandsTensorViewMask + iVar37 + 2U +
                   (uint)((TVar19 >> 1 & 1) != 0))) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30," not enough tensor addressing operands.",0x27);
          goto LAB_0069480e;
        }
        uVar14 = iVar37 + 3;
        if ((TVar19 & TensorAddressingOperandsTensorViewMask) != MaskNone) {
          local_298 = (Instruction *)CONCAT44(local_298._4_4_,TVar19);
          local_290 = uVar14;
          local_28c = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar14);
          pIVar27 = ValidationState_t::FindDef(_,local_28c);
          if ((pIVar27 == (Instruction *)0x0) ||
             (pIVar27 = ValidationState_t::FindDef(_,(pIVar27->inst_).type_id),
             (pIVar27->inst_).opcode != 0x14fb)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pDVar30 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)&local_280);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar30," TensorView <id> ",0x11);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,local_28c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar30,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar30," does not have a tensor view type.",0x22);
            sVar16 = pDVar30->error_;
            if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
              operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
            bVar11 = false;
            uVar14 = local_290;
          }
          else {
            bVar11 = true;
            uVar14 = iVar37 + 4;
          }
          TVar19 = (TensorAddressingOperandsMask)local_298;
          sVar15 = sVar16;
          if (!bVar11) goto LAB_00692aca;
        }
        if ((TVar19 & DecodeFunc) == MaskNone) goto LAB_00692e1b;
        if (*(short *)((long)&(inst->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14f8) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar39 = "OpCooperativeMatrixStoreTensorNV does not support DecodeFunc.";
          lVar35 = 0x3d;
          goto LAB_00692704;
        }
        local_298 = (Instruction *)inst;
        local_290 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar14);
        pIVar27 = ValidationState_t::FindDef(_,local_290);
        if ((pIVar27 == (Instruction *)0x0) || ((pIVar27->inst_).opcode != 0x36)) {
          ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,local_298);
          pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30," DecodeFunc <id> ",0x11);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,local_290);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
          pcVar39 = " is not a function.";
          lVar35 = 0x13;
LAB_0069591f:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar30,pcVar39,lVar35);
          sVar16 = pDVar30->error_;
          if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
            operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
          bVar11 = false;
        }
        else {
          uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,1);
          uVar18 = Instruction::GetOperandAs<unsigned_int>(pIVar27,3);
          pIVar24 = ValidationState_t::FindDef(_,uVar18);
          uVar18 = Instruction::GetOperandAs<unsigned_int>(pIVar24,1);
          if (uVar18 != uVar14) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,local_298)
            ;
            pDVar30 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)&local_280);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar30," DecodeFunc <id> ",0x11);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,local_290);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar30,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
            pcVar39 = " return type must match matrix component type.";
            lVar35 = 0x2e;
            goto LAB_0069591f;
          }
          uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,2);
          pIVar27 = ValidationState_t::FindDef(_,uVar14);
          SVar22 = Instruction::GetOperandAs<spv::StorageClass>(pIVar27,1);
          if (SVar22 != PhysicalStorageBuffer) {
            ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,local_298)
            ;
            pDVar30 = DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)&local_280);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar30," DecodeFunc <id> ",0x11);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,local_290);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar30,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
            pcVar39 = " first parameter must be pointer to PhysicalStorageBuffer.";
            lVar35 = 0x3a;
            goto LAB_0069591f;
          }
          local_288 = ValidationState_t::FindDef(_,(local_288->inst_).type_id);
          sVar41 = 3;
          do {
            uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,sVar41);
            pIVar27 = ValidationState_t::FindDef(_,uVar14);
            if ((pIVar27->inst_).opcode == 0x1c) {
              uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
              bVar7 = ValidationState_t::EvalConstantValUint64(_,uVar14,(uint64_t *)&local_2b8);
              bVar11 = true;
              if (bVar7) {
                uVar14 = Instruction::GetOperandAs<unsigned_int>(local_288,1);
                bVar7 = ValidationState_t::EvalConstantValUint64(_,uVar14,(uint64_t *)&local_258);
                bVar11 = true;
                if ((bVar7) &&
                   ((_Tuple_impl<1UL,_bool,_unsigned_int>)local_2b8._M_dataplus._M_p != local_258))
                {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,local_298);
                  pDVar30 = DiagnosticStream::operator<<
                                      ((DiagnosticStream *)&local_218,(char **)&local_280);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)pDVar30," DecodeFunc <id> ",0x11);
                  goto LAB_00695773;
                }
              }
            }
            else {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,local_298);
              pDVar30 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)&local_280);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar30," DecodeFunc <id> ",0x11);
LAB_00695773:
              ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,local_290);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar30,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar30,
                         " second/third parameter must be array of 32-bit integer with ",0x3d);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar30," dimension equal to the tensor dimension.",0x29);
              sVar16 = pDVar30->error_;
              if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
                operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
              }
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
              bVar11 = false;
            }
          } while ((bVar11) && (bVar7 = sVar41 != 4, sVar41 = sVar41 + 1, bVar7));
        }
        sVar15 = sVar16;
        if (bVar11) goto LAB_00692e1b;
        goto LAB_00692aca;
      }
      if (sVar5 == 0x14f7) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pcVar39 = "spv::Op::OpCooperativeMatrixLoadTensorNV Result Type <id> ";
        lVar35 = 0x3a;
      }
      else {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pcVar39 = "spv::Op::OpCooperativeMatrixStoreTensorNV Object type <id> ";
        lVar35 = 0x3b;
      }
LAB_0069201a:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar39,lVar35);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_)
      ;
      pcVar39 = " is not a cooperative matrix type.";
LAB_0069204a:
      p_Var29 = &local_218;
      lVar35 = 0x22;
LAB_00692a94:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)p_Var29->_M_pod_data,pcVar39,lVar35);
      local_208._448_4_ = *(undefined4 *)(p_Var29->_M_pod_data + 0x1d0);
LAB_00692aab:
      uVar40 = local_2c8;
      uVar43 = local_2d8._M_unused._0_8_;
      sVar16 = local_208._448_4_;
      if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) goto LAB_00692ab5;
      goto LAB_00692ac5;
    }
    switch(uVar2) {
    case 0x14a9:
    case 0x14ac:
      bVar11 = opcode == OpCooperativeVectorMatrixMulAddNV;
      local_280._M_unused._M_object = "spv::Op::OpCooperativeVectorMatrixMulNV";
      if (bVar11) {
        local_280._M_unused._M_object = "spv::Op::OpCooperativeVectorMatrixMulAddNV";
      }
      sVar41 = (ulong)bVar11 * 3 + 7;
      uVar32 = (ulong)((uint)bVar11 * 3 + 8);
      index = (__buckets_ptr)(ulong)((uint)bVar11 * 3 + 9);
      local_2b8._M_dataplus._M_p = (pointer)inst;
      uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,0);
      local_288 = (Instruction *)CONCAT44(local_288._4_4_,uVar14);
      local_24c = Instruction::GetOperandAs<unsigned_int>
                            ((Instruction *)local_2b8._M_dataplus._M_p,2);
      uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)local_2b8._M_dataplus._M_p,3);
      local_298 = (Instruction *)CONCAT44(local_298._4_4_,uVar14);
      local_28c = Instruction::GetOperandAs<unsigned_int>
                            ((Instruction *)local_2b8._M_dataplus._M_p,6);
      uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)local_2b8._M_dataplus._M_p,9);
      local_230 = CONCAT44(local_230._4_4_,uVar14);
      local_238 = sVar41;
      local_290 = Instruction::GetOperandAs<unsigned_int>
                            ((Instruction *)local_2b8._M_dataplus._M_p,sVar41);
      local_240 = uVar32;
      uVar14 = Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)local_2b8._M_dataplus._M_p,uVar32);
      uVar18 = Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)local_2b8._M_dataplus._M_p,(size_t)index);
      uVar12 = Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)local_2b8._M_dataplus._M_p,(ulong)((uint)bVar11 * 3 + 10));
      sVar16 = anon_unknown_2::ValidateCooperativeVectorPointer
                         (_,(Instruction *)local_2b8._M_dataplus._M_p,
                          (char *)local_280._M_unused._0_8_,4);
      sVar15 = sVar16;
      if ((sVar16 != SPV_SUCCESS) ||
         ((_local_25c = uVar12, local_250 = uVar14, local_224 = uVar18, local_208._456_8_ = index,
          *(short *)(local_2b8._M_dataplus._M_p + 0x3a) == 0x14ac &&
          (sVar15 = anon_unknown_2::ValidateCooperativeVectorPointer
                              (_,(Instruction *)local_2b8._M_dataplus._M_p,
                               (char *)local_280._M_unused._0_8_,7), sVar15 != SPV_SUCCESS))))
      goto LAB_00692aca;
      uVar17 = (spv_result_t)local_288;
      pIVar24 = ValidationState_t::FindDef(_,(spv_result_t)local_288);
      if ((pIVar24->inst_).opcode == 0x14a8) {
        uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,1);
        bVar11 = ValidationState_t::IsIntScalarType(_,uVar14);
        if (((!bVar11) || (uVar17 = ValidationState_t::GetBitWidth(_,uVar14), uVar17 != 0x20)) &&
           ((bVar11 = ValidationState_t::IsFloatScalarType(_,uVar14), !bVar11 ||
            ((uVar17 = ValidationState_t::GetBitWidth(_,uVar14), uVar17 != 0x20 &&
             (uVar17 = ValidationState_t::GetBitWidth(_,uVar14), uVar17 != 0x10)))))) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                     (Instruction *)local_2b8._M_dataplus._M_p);
          pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30," result component type <id> ",0x1c);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
          pcVar39 = " is not a 32 bit int or 16/32 bit float.";
          lVar35 = 0x28;
          goto LAB_00692c3d;
        }
        ValidationState_t::EvalInt32IfConst
                  ((tuple<bool,_bool,_unsigned_int> *)&local_258,_,local_290);
        uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,2);
        ValidationState_t::EvalInt32IfConst(&local_248,_,uVar14);
        if (((local_258.super__Head_base<1UL,_bool,_false>._M_head_impl != true) ||
            (local_248.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
             super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>.
             _M_head_impl != true)) ||
           (local_258.super__Tuple_impl<2UL,_unsigned_int>.
            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl ==
            local_248.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
            super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl)) {
          ValidationState_t::EvalInt32IfConst(&local_220,_,local_250);
          pIVar24 = ValidationState_t::FindDef(_,local_24c);
          pIVar24 = ValidationState_t::FindDef(_,(pIVar24->inst_).type_id);
          uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,2);
          ValidationState_t::EvalInt32IfConst(&local_38,_,(TensorAddressingOperandsMask)local_298);
          id = _local_25c;
          if ((local_38.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
               super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>.
               _M_head_impl == true) &&
             (((uint)local_38.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
                     super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>
                     .super__Head_base<2UL,_unsigned_int,_false>._M_head_impl & 0xfffffffe) !=
              0x3ba247f8)) {
            ValidationState_t::EvalInt32IfConst
                      ((tuple<bool,_bool,_unsigned_int> *)&local_2d8,_,uVar14);
            bVar11 = true;
            uVar14 = local_28c;
            uVar17 = (TensorAddressingOperandsMask)local_298;
            if ((((bool)local_2d8._M_pod_data[4] == true) &&
                (local_220.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
                 super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Head_base<1UL,_bool,_false>.
                 _M_head_impl == true)) &&
               ((_Head_base<2UL,_unsigned_int,_false>)local_2d8._0_4_ !=
                local_220.super__Tuple_impl<0UL,_bool,_bool,_unsigned_int>.
                super__Tuple_impl<1UL,_bool,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int>.
                super__Head_base<2UL,_unsigned_int,_false>._M_head_impl)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                         (Instruction *)local_2b8._M_dataplus._M_p);
              pDVar30 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)&local_280);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar30," input number of components ",0x1c);
              std::ostream::_M_insert<unsigned_long>((ulong)pDVar30);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar30," does not match K ",0x12);
              std::ostream::_M_insert<unsigned_long>((ulong)pDVar30);
              uVar14 = local_28c;
              sVar16 = pDVar30->error_;
              uVar17 = (TensorAddressingOperandsMask)local_298;
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
              bVar11 = false;
            }
            sVar15 = sVar16;
            if (!bVar11) goto LAB_00692aca;
          }
          else {
            uVar14 = local_28c;
            uVar17 = (TensorAddressingOperandsMask)local_298;
          }
          pIVar24 = ValidationState_t::FindDef(_,id);
          bVar11 = ValidationState_t::IsBoolScalarType(_,(pIVar24->inst_).type_id);
          if (!bVar11) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                       (Instruction *)local_2b8._M_dataplus._M_p);
            p_Var29 = (_Any_data *)
                      DiagnosticStream::operator<<
                                ((DiagnosticStream *)&local_218,(char **)&local_280);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)p_Var29->_M_pod_data," Transpose <id> ",0x10);
            ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)p_Var29->_M_pod_data,(char *)local_2d8._M_unused._0_8_,
                       local_2d8._8_8_);
            pcVar39 = " is not a scalar boolean.";
            lVar35 = 0x19;
            goto LAB_00692a94;
          }
          local_218._8_8_ = &local_2b8;
          local_208._0_8_ = &local_280;
          local_218._M_unused._M_object = _;
          sVar15 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::anon_class_24_3_28eea47e::
                   operator()((anon_class_24_3_28eea47e *)&local_218,uVar17,"InputInterpretation");
          if ((sVar15 == SPV_SUCCESS) &&
             (sVar15 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                       anon_class_24_3_28eea47e::operator()
                                 ((anon_class_24_3_28eea47e *)&local_218,uVar14,
                                  "MatrixInterpretation"), sVar15 == SPV_SUCCESS)) {
            if (opcode == OpCooperativeVectorMatrixMulAddNV) {
              sVar15 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                       anon_class_24_3_28eea47e::operator()
                                 ((anon_class_24_3_28eea47e *)&local_218,(uint32_t)local_230,
                                  "BiasInterpretation");
              if (sVar15 != SPV_SUCCESS) goto LAB_00692aca;
            }
            sVar15 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::anon_class_24_3_28eea47e
                     ::operator()((anon_class_24_3_28eea47e *)&local_218,local_290,"M");
            if (((((((sVar15 == SPV_SUCCESS) &&
                    (sVar15 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                              anon_class_24_3_28eea47e::operator()
                                        ((anon_class_24_3_28eea47e *)&local_218,local_250,"K"),
                    sVar15 == SPV_SUCCESS)) &&
                   (sVar15 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                             anon_class_24_3_28eea47e::operator()
                                       ((anon_class_24_3_28eea47e *)&local_218,local_224,
                                        "MemoryLayout"), sVar15 == SPV_SUCCESS)) &&
                  ((sVar15 = anon_unknown_2::ValidateCooperativeVectorMatrixMulNV::
                             anon_class_24_3_28eea47e::operator()
                                       ((anon_class_24_3_28eea47e *)&local_218,_local_25c,
                                        "Transpose"), sVar15 == SPV_SUCCESS &&
                   (sVar15 = anon_unknown_2::ValidateInt32Operand
                                       (_,(Instruction *)local_2b8._M_dataplus._M_p,3,
                                        (char *)local_280._M_unused._0_8_,"InputInterpretation"),
                   sVar15 == SPV_SUCCESS)))) &&
                 (sVar15 = anon_unknown_2::ValidateInt32Operand
                                     (_,(Instruction *)local_2b8._M_dataplus._M_p,6,
                                      (char *)local_280._M_unused._0_8_,"MatrixInterpretation"),
                 sVar15 == SPV_SUCCESS)) &&
                ((opcode != OpCooperativeVectorMatrixMulAddNV ||
                 (sVar15 = anon_unknown_2::ValidateInt32Operand
                                     (_,(Instruction *)local_2b8._M_dataplus._M_p,9,
                                      (char *)local_280._M_unused._0_8_,"BiasInterpretation"),
                 sVar15 == SPV_SUCCESS)))) &&
               ((sVar15 = anon_unknown_2::ValidateInt32Operand
                                    (_,(Instruction *)local_2b8._M_dataplus._M_p,(uint32_t)local_238
                                     ,(char *)local_280._M_unused._0_8_,"M"), sVar15 == SPV_SUCCESS
                && (sVar15 = anon_unknown_2::ValidateInt32Operand
                                       (_,(Instruction *)local_2b8._M_dataplus._M_p,
                                        (uint32_t)local_240,(char *)local_280._M_unused._0_8_,"K"),
                   sVar15 == SPV_SUCCESS)))) {
              operand_name = "MemoryLayout";
              uVar17 = (uint32_t)local_208._456_8_;
              pcVar39 = (char *)local_280._M_unused._0_8_;
              inst = (Instruction *)local_2b8._M_dataplus._M_p;
              goto LAB_0069121d;
            }
          }
          goto LAB_00692aca;
        }
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                   (Instruction *)local_2b8._M_dataplus._M_p);
        pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar30," result type number of components ",0x22);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar30);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar30," does not match M ",0x12);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar30);
LAB_0069480e:
        local_208._448_4_ = pDVar30->error_;
        goto LAB_00692ac5;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                 (Instruction *)local_2b8._M_dataplus._M_p);
      pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar30," result type <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar30,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
      pcVar39 = " is not a cooperative vector type.";
      lVar35 = 0x22;
LAB_00692c3d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar30,pcVar39,lVar35);
      local_208._448_4_ = pDVar30->error_;
      goto LAB_00692aab;
    case 0x14aa:
      local_280._M_unused._M_object = "spv::Op::OpCooperativeVectorOuterProductAccumulateNV";
      sVar15 = anon_unknown_2::ValidateCooperativeVectorPointer
                         (_,inst,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",0);
      if (sVar15 != SPV_SUCCESS) goto LAB_00692aca;
      uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      pIVar24 = ValidationState_t::FindDef(_,uVar14);
      uVar17 = (pIVar24->inst_).type_id;
      pIVar24 = ValidationState_t::FindDef(_,uVar17);
      if ((pIVar24->inst_).opcode != 0x14a8) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280);
        pcVar39 = " A type <id> ";
LAB_006928ee:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar30,pcVar39,0xd);
LAB_00692906:
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar30,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar30," is not a cooperative vector type.",0x22);
        local_208._448_4_ = pDVar30->error_;
        goto LAB_00692aab;
      }
      uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
      pIVar27 = ValidationState_t::FindDef(_,uVar14);
      uVar17 = (pIVar27->inst_).type_id;
      pIVar27 = ValidationState_t::FindDef(_,uVar17);
      if ((pIVar27->inst_).opcode != 0x14a8) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar30," B type <id> ",0xd);
        goto LAB_00692906;
      }
      uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,1);
      uVar18 = Instruction::GetOperandAs<unsigned_int>(pIVar27,1);
      if (uVar14 != uVar18) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar30," A and B component types ",0x19);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar30,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar30," and ",5);
        ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,uVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar30,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar30," do not match.",0xe);
        local_208._448_4_ = pDVar30->error_;
LAB_006944fa:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00692aab;
      }
      sVar15 = anon_unknown_2::ValidateInt32Operand
                         (_,inst,1,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV","Offset");
      if (((sVar15 != SPV_SUCCESS) ||
          (sVar15 = anon_unknown_2::ValidateInt32Operand
                              (_,inst,4,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",
                               "MemoryLayout"), sVar15 != SPV_SUCCESS)) ||
         (sVar15 = anon_unknown_2::ValidateInt32Operand
                             (_,inst,5,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",
                              "MatrixInterpretation"), sVar15 != SPV_SUCCESS)) goto LAB_00692aca;
      if ((ulong)((long)inst->context_ -
                 *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_)
          < 0x61) goto LAB_00692e1b;
      sVar15 = anon_unknown_2::ValidateInt32Operand
                         (_,inst,6,"spv::Op::OpCooperativeVectorOuterProductAccumulateNV",
                          "MatrixStride");
      goto LAB_006912b9;
    case 0x14ab:
      local_2b8._M_dataplus._M_p = "spv::Op::OpCooperativeVectorReduceSumAccumulateNV";
      sVar15 = anon_unknown_2::ValidateCooperativeVectorPointer
                         (_,inst,"spv::Op::OpCooperativeVectorReduceSumAccumulateNV",0);
      if (sVar15 == SPV_SUCCESS) {
        uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
        pIVar24 = ValidationState_t::FindDef(_,uVar14);
        uVar17 = (pIVar24->inst_).type_id;
        pIVar24 = ValidationState_t::FindDef(_,uVar17);
        if ((pIVar24->inst_).opcode != 0x14a8) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_2b8)
          ;
          pcVar39 = " V type <id> ";
          goto LAB_006928ee;
        }
        pcVar39 = "spv::Op::OpCooperativeVectorReduceSumAccumulateNV";
        operand_name = "Offset";
        uVar17 = 1;
LAB_0069121d:
        sVar15 = anon_unknown_2::ValidateInt32Operand(_,inst,uVar17,pcVar39,operand_name);
      }
      goto LAB_00692aca;
    case 0x14ad:
    case 0x14ae:
    case 0x14af:
    case 0x14b0:
    case 0x14b1:
    case 0x14b2:
    case 0x14b3:
    case 0x14b4:
    case 0x14b5:
      goto switchD_006909d1_caseD_3c;
    case 0x14b6:
      pcVar39 = "spv::Op::OpCooperativeVectorLoadNV";
      pIVar24 = (Instruction *)inst;
      break;
    case 0x14b7:
      uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      pIVar24 = ValidationState_t::FindDef(_,uVar14);
      pcVar39 = "spv::Op::OpCooperativeVectorStoreNV";
      break;
    default:
      if (1 < uVar2 - 0x1169) {
        if (opcode != OpCooperativeMatrixLengthKHR) goto switchD_006909d1_caseD_3c;
LAB_00690eb1:
        pcVar39 = spvOpcodeString(opcode);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_218._M_pod_data,pcVar39,(allocator<char> *)&local_2b8);
        puVar26 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x7c6340);
        local_2d8._M_unused._M_object = &local_2c8;
        pp_Var31 = (_Any_data **)(puVar26 + 2);
        if ((_Any_data **)*puVar26 == pp_Var31) {
          local_2c8 = *pp_Var31;
          pcStack_2c0 = (code *)puVar26[3];
        }
        else {
          local_2c8 = *pp_Var31;
          local_2d8._M_unused._M_object = (_Any_data **)*puVar26;
        }
        local_2d8._8_8_ = puVar26[1];
        *puVar26 = pp_Var31;
        puVar26[1] = 0;
        *(undefined1 *)(puVar26 + 2) = 0;
        if ((ValidationState_t *)local_218._M_unused._0_8_ != (ValidationState_t *)local_208) {
          operator_delete(local_218._M_unused._M_object,(ulong)(local_208._0_8_ + 1));
        }
        pIVar24 = ValidationState_t::FindDef
                            (_,*(uint32_t *)
                                &(inst->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
        if ((((pIVar24->inst_).opcode != 0x15) ||
            (uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,1), uVar14 != 0x20)) ||
           (uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,2), uVar14 != 0))
        goto LAB_00691dc4;
        sVar5 = *(short *)((long)&(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 2);
        uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
        pIVar24 = ValidationState_t::FindDef(_,uVar14);
        uVar3 = (pIVar24->inst_).opcode;
        if (sVar5 != 0x116c) {
          if (uVar3 == 0x14ee) goto LAB_006930ad;
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"The type in ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                     local_2d8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          pcVar39 = " must be OpTypeCooperativeMatrixNV.";
          lVar35 = 0x23;
          goto LAB_00691e48;
        }
        if (uVar3 != 0x1168) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"The type in ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                     local_2d8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," <id> ",6);
          ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          pcVar39 = " must be OpTypeCooperativeMatrixKHR.";
          lVar35 = 0x24;
          goto LAB_00691e48;
        }
LAB_006930ad:
        sVar15 = SPV_SUCCESS;
        goto LAB_00691e7e;
      }
      if (opcode == OpCooperativeMatrixLoadKHR) {
        local_280._M_unused._M_object = "spv::Op::OpCooperativeMatrixLoadKHR";
        pIVar24 = (Instruction *)inst;
      }
      else {
        uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
        pIVar24 = ValidationState_t::FindDef(_,uVar14);
        local_280._M_unused._M_object = "spv::Op::OpCooperativeMatrixStoreKHR";
      }
      uVar17 = (pIVar24->inst_).type_id;
      pIVar24 = ValidationState_t::FindDef(_,uVar17);
      sVar5 = *(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2);
      if ((pIVar24->inst_).opcode != 0x1168) {
        if (sVar5 == 0x1169) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar39 = "spv::Op::OpCooperativeMatrixLoadKHR Result Type <id> ";
LAB_00691fef:
          lVar35 = 0x35;
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar39 = "spv::Op::OpCooperativeMatrixStoreKHR Object type <id> ";
          lVar35 = 0x36;
        }
        goto LAB_0069201a;
      }
      sVar16 = Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)inst,(ulong)((uint)(sVar5 == 0x1169) * 2));
      pIVar24 = ValidationState_t::FindDef(_,sVar16);
      if ((pIVar24 == (Instruction *)0x0) ||
         ((AVar13 = ValidationState_t::addressing_model(_), AVar13 == AddressingModelLogical &&
          ((((_->features_).variable_pointers == false &&
            (iVar21 = spvOpcodeReturnsLogicalPointer((uint)(pIVar24->inst_).opcode), iVar21 == 0))
           || (((_->features_).variable_pointers == true &&
               (bVar11 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar24->inst_).opcode),
               !bVar11)))))))) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        val = (string *)&local_280;
LAB_00692775:
        p_Var29 = (_Any_data *)
                  DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)val);
        pcVar39 = " Pointer <id> ";
        lVar35 = 0xe;
        goto LAB_00692a62;
      }
      uVar34 = (pIVar24->inst_).type_id;
      pIVar27 = ValidationState_t::FindDef(_,uVar34);
      if (pIVar27 == (Instruction *)0x0) {
LAB_00692455:
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        p_Var29 = (_Any_data *)
                  DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280);
        pcVar39 = " type for pointer <id> ";
        lVar35 = 0x17;
        goto LAB_00692494;
      }
      uVar2 = (pIVar27->inst_).opcode;
      sVar15 = (spv_result_t)uVar2;
      if ((uVar2 != 0x20) && (uVar2 != 0x1141)) goto LAB_00692455;
      SVar22 = Instruction::GetOperandAs<spv::StorageClass>(pIVar27,1);
      bVar11 = spvIsVulkanEnv(_->context_->target_env);
      if ((((bVar11) && (SVar22 != StorageClassWorkgroup)) && (SVar22 != StorageBuffer)) &&
         (SVar22 != PhysicalStorageBuffer)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2d8,_,0x230d,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                   local_2d8._8_8_);
        pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar30," storage class for pointer type <id> ",0x25);
        goto LAB_006944c8;
      }
      if (uVar2 != 0x1141) {
        uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
        pIVar27 = ValidationState_t::FindDef(_,uVar14);
        if (pIVar27 == (Instruction *)0x0) {
LAB_006941dc:
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pDVar30 = DiagnosticStream::operator<<((DiagnosticStream *)&local_218,(char **)&local_280)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30," Pointer <id> ",0xe);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,(pIVar24->inst_).result_id)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar30,"s Type must be a scalar or vector type.",0x27);
          sVar15 = pDVar30->error_;
          if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
            operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
          bVar11 = false;
        }
        else {
          bVar7 = ValidationState_t::IsIntScalarOrVectorType(_,uVar14);
          bVar11 = true;
          if ((!bVar7) && (bVar7 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar14), !bVar7))
          goto LAB_006941dc;
        }
        if (!bVar11) goto LAB_00692aca;
      }
      uVar14 = Instruction::GetOperandAs<unsigned_int>
                         ((Instruction *)inst,
                          (ulong)(*(short *)((long)&(inst->operands_).
                                                                                                        
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 2) ==
                                 0x1169) | 2);
      pIVar24 = ValidationState_t::FindDef(_,uVar14);
      if (((pIVar24 == (Instruction *)0x0) ||
          (bVar11 = ValidationState_t::IsIntScalarType(_,(pIVar24->inst_).type_id), !bVar11)) ||
         (iVar21 = spvOpcodeIsConstant((uint)(pIVar24->inst_).opcode), iVar21 == 0)) {
        p_Var29 = &local_218;
        ValidationState_t::diag
                  ((DiagnosticStream *)p_Var29,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)p_Var29->_M_pod_data,"MemoryLayout operand <id> ",0x1a);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)p_Var29->_M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_
                  );
        pcVar39 = " must be a 32-bit integer constant instruction.";
        lVar35 = 0x2f;
        goto LAB_00692a94;
      }
      bVar11 = ValidationState_t::EvalConstantValUint64(_,uVar14,(uint64_t *)&local_2b8);
      sVar41 = (ulong)(*(short *)((long)&(inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2) == 0x1169) +
               3;
      if (sVar41 < (ulong)((long)inst->context_ -
                           *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                     is_sentinel_ >> 4)) {
        uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,sVar41);
        pIVar24 = ValidationState_t::FindDef(_,uVar14);
        if (pIVar24 == (Instruction *)0x0) {
LAB_0069434c:
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"Stride operand <id> ",0x14);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                     local_2d8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data," must be a scalar integer type.",0x1f);
          if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
            operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
          bVar11 = false;
          sVar15 = local_208._448_4_;
        }
        else {
          bVar7 = ValidationState_t::IsIntScalarType(_,(pIVar24->inst_).type_id);
          bVar11 = true;
          if (!bVar7) goto LAB_0069434c;
        }
        if (!bVar11) goto LAB_00692aca;
      }
      else if (bVar11 && local_2b8._M_dataplus._M_p < 2) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"MemoryLayout ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_218);
        pcVar39 = " requires a Stride.";
        lVar35 = 0x13;
        goto LAB_00692704;
      }
      uVar14 = *(short *)((long)&(inst->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 2) == 0x1169 | 4;
      goto LAB_00691299;
    }
    uVar17 = (pIVar24->inst_).type_id;
    pIVar24 = ValidationState_t::FindDef(_,uVar17);
    sVar5 = *(short *)((long)&(inst->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_start + 2);
    if ((pIVar24->inst_).opcode != 0x14a8) {
      if (sVar5 == 0x14b6) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pcVar39 = "spv::Op::OpCooperativeVectorLoadNV Result Type <id> ";
        lVar35 = 0x34;
      }
      else {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pcVar39 = "spv::Op::OpCooperativeVectorStoreNV Object type <id> ";
        lVar35 = 0x35;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar39,lVar35);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_)
      ;
      pcVar39 = " is not a cooperative vector type.";
      goto LAB_0069204a;
    }
    sVar15 = anon_unknown_2::ValidateCooperativeVectorPointer
                       (_,inst,pcVar39,(uint)(sVar5 == 0x14b6) * 2);
    if (sVar15 != SPV_SUCCESS) goto LAB_00692aca;
    uVar14 = (*(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2) == 0x14b6) + 3;
LAB_00691299:
    if ((ulong)uVar14 <
        (ulong)((long)inst->context_ -
                *(long *)&(inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_
               >> 4)) {
      sVar15 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar14);
LAB_006912b9:
      if (sVar15 != SPV_SUCCESS) goto LAB_00692aca;
    }
    goto LAB_00692e1b;
  }
  switch(uVar2) {
  case 0x3b:
switchD_006909d1_caseD_3b:
    sVar16 = anon_unknown_2::ValidateVariable(_,inst);
    goto LAB_00690e86;
  case 0x3c:
  case 0x45:
    goto switchD_006909d1_caseD_3c;
  case 0x3d:
    pIVar24 = ValidationState_t::FindDef
                        (_,*(uint32_t *)
                            &(inst->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
    if (pIVar24 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpLoad Result Type <id> ",0x18);
      uVar17 = *(uint32_t *)
                &(inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00692115;
    }
    sVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
    pIVar27 = ValidationState_t::FindDef(_,sVar16);
    if ((pIVar27 == (Instruction *)0x0) ||
       ((AVar13 = ValidationState_t::addressing_model(_), AVar13 == AddressingModelLogical &&
        ((((_->features_).variable_pointers == false &&
          (iVar21 = spvOpcodeReturnsLogicalPointer((uint)(pIVar27->inst_).opcode), iVar21 == 0)) ||
         (((_->features_).variable_pointers == true &&
          (bVar11 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar27->inst_).opcode), !bVar11))
         )))))) {
      p_Var29 = &local_218;
      ValidationState_t::diag
                ((DiagnosticStream *)p_Var29,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      pcVar39 = "OpLoad Pointer <id> ";
      lVar35 = 0x14;
LAB_00692a62:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)p_Var29->_M_pod_data,pcVar39,lVar35);
      goto LAB_00692a74;
    }
    pIVar28 = ValidationState_t::FindDef(_,(pIVar27->inst_).type_id);
    if (pIVar28 == (Instruction *)0x0) {
LAB_00691172:
      p_Var29 = &local_218;
      ValidationState_t::diag
                ((DiagnosticStream *)p_Var29,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      pcVar39 = "OpLoad type for pointer <id> ";
      lVar35 = 0x1d;
      goto LAB_006923b8;
    }
    uVar3 = (pIVar28->inst_).opcode;
    if (uVar3 == 0x20) {
      uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar28,2);
      pIVar28 = ValidationState_t::FindDef(_,uVar14);
      if ((pIVar28 == (Instruction *)0x0) ||
         ((pIVar24->inst_).result_id != (pIVar28->inst_).result_id)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"OpLoad Result Type <id> ",0x18);
        ValidationState_t::getIdName_abi_cxx11_
                  ((string *)&local_2d8,_,
                   *(uint32_t *)
                    &(inst->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                   local_2d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data," does not match Pointer <id> ",0x1d);
        ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,(pIVar27->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                   local_2b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"s type.",7);
        pIVar27 = (Instruction *)(ulong)(uint)local_208._448_4_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
          operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        bVar11 = false;
      }
      else {
        bVar11 = true;
      }
      sVar15 = (spv_result_t)pIVar27;
      if (!bVar11) break;
    }
    else if (uVar3 != 0x1141) goto LAB_00691172;
    if ((_->options_->before_hlsl_legalization != false) ||
       (bVar11 = ValidationState_t::ContainsRuntimeArray
                           (_,*(uint32_t *)
                               &(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish), !bVar11)) {
      sVar15 = anon_unknown_2::CheckMemoryAccess(_,inst,3);
      if (sVar15 == SPV_SUCCESS) {
        bVar11 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if ((((bVar11) &&
             (bVar11 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                 (_,*(uint32_t *)
                                     &(inst->operands_).
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_finish), bVar11)) &&
            (uVar2 = (pIVar24->inst_).opcode, 3 < uVar2 - 0x15)) && (uVar2 != 0x20)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar39 = "8- or 16-bit loads must be a scalar, vector or matrix type";
          lVar35 = 0x3a;
          goto LAB_00692704;
        }
        ValidationState_t::RegisterQCOMImageProcessingTextureConsumer
                  (_,sVar16,(Instruction *)inst,(Instruction *)0x0);
        sVar15 = SPV_SUCCESS;
      }
      break;
    }
    ValidationState_t::diag
              ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
    pcVar39 = "Cannot load a runtime-sized array";
    lVar35 = 0x21;
LAB_00692704:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218._M_pod_data,pcVar39,lVar35);
    goto LAB_00692ac5;
  case 0x3e:
    sVar16 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,0);
    pIVar24 = ValidationState_t::FindDef(_,sVar16);
    if ((pIVar24 == (Instruction *)0x0) ||
       ((AVar13 = ValidationState_t::addressing_model(_), AVar13 == AddressingModelLogical &&
        ((((_->features_).variable_pointers == false &&
          (iVar21 = spvOpcodeReturnsLogicalPointer((uint)(pIVar24->inst_).opcode), iVar21 == 0)) ||
         (((_->features_).variable_pointers == true &&
          (bVar11 = spvOpcodeReturnsLogicalVariablePointer((uint)(pIVar24->inst_).opcode), !bVar11))
         )))))) {
      p_Var29 = &local_218;
      ValidationState_t::diag
                ((DiagnosticStream *)p_Var29,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)p_Var29->_M_pod_data,"OpStore Pointer <id> ",0x15);
LAB_00692a74:
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,sVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)p_Var29->_M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
      pcVar39 = " is not a logical pointer.";
      lVar35 = 0x1a;
      goto LAB_00692a94;
    }
    pIVar27 = ValidationState_t::FindDef(_,(pIVar24->inst_).type_id);
    if (pIVar27 == (Instruction *)0x0) {
LAB_00692424:
      p_Var29 = &local_218;
      ValidationState_t::diag
                ((DiagnosticStream *)p_Var29,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      pcVar39 = "OpStore type for pointer <id> ";
      lVar35 = 0x1e;
LAB_00692494:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)p_Var29->_M_pod_data,pcVar39,lVar35);
      goto LAB_006924a6;
    }
    uVar3 = (pIVar27->inst_).opcode;
    pVVar44 = _;
    if (uVar3 == 0x20) {
      uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
      local_298 = ValidationState_t::FindDef(_,uVar14);
      if ((local_298 == (Instruction *)0x0) || ((local_298->inst_).opcode == 0x13)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
        local_288 = (Instruction *)CONCAT44(local_288._4_4_,sVar16);
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,sVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                   local_2d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"s type is void.",0xf);
        pVVar44 = (ValidationState_t *)(ulong)(uint)local_208._448_4_;
        if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
          operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        bVar11 = false;
        sVar16 = (spv_result_t)local_288;
      }
      else {
        bVar11 = true;
      }
      sVar15 = (spv_result_t)pVVar44;
      if (!bVar11) break;
    }
    else {
      if (uVar3 != 0x1141) goto LAB_00692424;
      local_298 = (Instruction *)0x0;
    }
    sVar23 = (spv_result_t)pVVar44;
    local_288 = (Instruction *)CONCAT44(local_288._4_4_,sVar16);
    bVar11 = ValidationState_t::GetPointerTypeInfo
                       (_,(pIVar27->inst_).result_id,(uint32_t *)local_280._M_pod_data,
                        (StorageClass *)&local_258);
    if (bVar11) {
      if (((uint)local_258.super__Tuple_impl<2UL,_unsigned_int>.
                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl < 10) &&
         ((0x203U >> ((uint)local_258.super__Tuple_impl<2UL,_unsigned_int>.
                            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl & 0x1f) & 1) !=
          0)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
        uVar17 = (spv_result_t)local_288;
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,(spv_result_t)local_288);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                   local_2d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data," storage class is read-only",0x1b);
        sVar23 = local_208._448_4_;
        if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
          operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
        }
LAB_00693f2d:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        bVar11 = false;
      }
      else {
        uVar17 = (spv_result_t)local_288;
        if (local_258.super__Tuple_impl<2UL,_unsigned_int>.
            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl == 0x14db) {
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_218,_,0x125f,(char *)0x0);
          this_01 = ValidationState_t::function
                              (_,*(uint32_t *)
                                  &(((inst->dbg_line_insts_).
                                     super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                                   _vptr_IntrusiveNodeBase);
          paVar1 = &local_2b8.field_2;
          local_2b8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b8,local_218._M_unused._M_object,
                     (undefined1 *)(local_218._8_8_ + (long)local_218._M_unused._0_8_));
          local_2c8 = (_Any_data *)0x0;
          pcStack_2c0 = (code *)0x0;
          local_2d8._M_unused._M_object = (void *)0x0;
          local_2d8._8_8_ = 0;
          local_2d8._M_unused._M_object = operator_new(0x20);
          *(Instruction ***)local_2d8._M_unused._0_8_ =
               (Instruction **)((long)local_2d8._M_unused._0_8_ + 0x10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p == paVar1) {
            *(Instruction **)((long)local_2d8._M_unused._0_8_ + 0x10) =
                 (Instruction *)local_2b8.field_2._M_allocated_capacity;
            *(undefined8 *)((long)local_2d8._M_unused._0_8_ + 0x18) = local_2b8.field_2._8_8_;
          }
          else {
            *(pointer *)local_2d8._M_unused._0_8_ = local_2b8._M_dataplus._M_p;
            *(size_type *)((long)local_2d8._M_unused._0_8_ + 0x10) =
                 local_2b8.field_2._M_allocated_capacity;
          }
          *(size_type *)((long)local_2d8._M_unused._0_8_ + 8) = local_2b8._M_string_length;
          local_2b8._M_string_length = 0;
          local_2b8.field_2._M_allocated_capacity =
               local_2b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          pcStack_2c0 = std::
                        _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp:1057:15)>
                        ::_M_invoke;
          local_2c8 = (_Any_data *)
                      std::
                      _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp:1057:15)>
                      ::_M_manager;
          local_2b8._M_dataplus._M_p = (pointer)paVar1;
          Function::RegisterExecutionModelLimitation
                    (this_01,(function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>
                              *)&local_2d8);
          if (local_2c8 != (_Any_data *)0x0) {
            (*(code *)local_2c8)(&local_2d8,&local_2d8,3);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          uVar17 = (spv_result_t)local_288;
          if ((ValidationState_t *)local_218._M_unused._0_8_ != (ValidationState_t *)local_208) {
            operator_delete(local_218._M_unused._M_object,(ulong)(local_208._0_8_ + 1));
          }
        }
        else if (local_258.super__Tuple_impl<2UL,_unsigned_int>.
                 super__Head_base<2UL,_unsigned_int,_false>._M_head_impl == 0x14df) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,
                     "ShaderRecordBufferKHR Storage Class variables are read only",0x3b);
          sVar23 = local_208._448_4_;
          goto LAB_00693f2d;
        }
        bVar7 = spvIsVulkanEnv(_->context_->target_env);
        bVar11 = true;
        if (((bVar7) &&
            (local_258.super__Tuple_impl<2UL,_unsigned_int>.
             super__Head_base<2UL,_unsigned_int,_false>._M_head_impl == 2)) &&
           (pIVar24 = ValidationState_t::TracePointer(_,pIVar24), (pIVar24->inst_).opcode == 0x3b))
        {
          uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,0);
          pIVar24 = ValidationState_t::FindDef(_,uVar14);
          uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,2);
          pIVar24 = ValidationState_t::FindDef(_,uVar14);
          if (((pIVar24->inst_).opcode & 0xfffe) == 0x1c) {
            uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,1);
            pIVar24 = ValidationState_t::FindDef(_,uVar14);
          }
          bVar11 = ValidationState_t::HasDecoration(_,(pIVar24->inst_).result_id,Block);
          if (bVar11) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            ValidationState_t::VkErrorID_abi_cxx11_(&local_2b8,_,0x1b0d,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                       local_2b8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,
                       "In the Vulkan environment, cannot store to Uniform Blocks",0x39);
            sVar23 = local_208._448_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
          }
          bVar11 = !bVar11;
        }
      }
    }
    else {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,(spv_result_t)local_288);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data," is not pointer type",0x14);
      sVar23 = local_208._448_4_;
      if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
        operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
      bVar11 = false;
      uVar17 = (spv_result_t)local_288;
    }
    sVar15 = sVar23;
    if (!bVar11) break;
    uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
    pIVar24 = ValidationState_t::FindDef(_,uVar14);
    if ((pIVar24 != (Instruction *)0x0) && (uVar34 = (pIVar24->inst_).type_id, uVar34 != 0)) {
      pIVar27 = ValidationState_t::FindDef(_,uVar34);
      if ((pIVar27 == (Instruction *)0x0) || (uVar3 = (pIVar27->inst_).opcode, uVar3 == 0x13)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"OpStore Object <id> ",0x14);
        ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,uVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                   local_2b8._M_string_length);
        pcVar39 = "s type is void.";
        lVar35 = 0xf;
        goto LAB_00694055;
      }
      if ((local_298 != (Instruction *)0x0) &&
         ((local_298->inst_).result_id != (pIVar27->inst_).result_id)) {
        if ((_->options_->relax_struct_store == true) &&
           ((uVar3 == 0x1e && ((local_298->inst_).opcode == 0x1e)))) {
          bVar11 = anon_unknown_2::AreLayoutCompatibleStructs
                             (_,(Instruction *)local_298,(Instruction *)pIVar27);
          if (bVar11) goto LAB_00694af6;
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
          ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,uVar17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"s layout does not match Object <id> ",0x24);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_280,_,(pIVar24->inst_).result_id)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_280._M_unused._0_8_,
                     local_280._8_8_);
          pcVar39 = "s layout.";
          lVar35 = 9;
        }
        else {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"OpStore Pointer <id> ",0x15);
          ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,uVar17);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"s type does not match Object <id> ",0x22);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_280,_,(pIVar24->inst_).result_id)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_280._M_unused._0_8_,
                     local_280._8_8_);
          pcVar39 = "s type.";
          lVar35 = 7;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,pcVar39,lVar35);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_unused._0_8_ != &local_270) {
          operator_delete(local_280._M_unused._M_object,local_270._M_allocated_capacity + 1);
        }
        goto LAB_0069406c;
      }
LAB_00694af6:
      sVar15 = anon_unknown_2::CheckMemoryAccess(_,inst,2);
      if (sVar15 != SPV_SUCCESS) break;
      bVar11 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if ((((bVar11) &&
           (bVar11 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                               (_,*(uint32_t *)
                                   &(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish), bVar11)) &&
          (uVar2 = (pIVar27->inst_).opcode, 3 < uVar2 - 0x15)) && (uVar2 != 0x20)) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        pcVar39 = "8- or 16-bit stores must be a scalar, vector or matrix type";
        lVar35 = 0x3b;
        goto LAB_00692704;
      }
      bVar11 = spvIsVulkanEnv(_->context_->target_env);
      if ((bVar11) && (_->options_->before_hlsl_legalization == false)) {
        local_218._M_unused._M_object = (void *)0x0;
        local_218._8_8_ = 0;
        local_208._8_8_ =
             std::
             _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp:1143:34)>
             ::_M_invoke;
        local_208._0_8_ =
             std::
             _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp:1143:34)>
             ::_M_manager;
        bVar11 = ValidationState_t::ContainsType
                           (_,(pIVar27->inst_).result_id,
                            (function<bool_(const_spvtools::val::Instruction_*)>_conflict *)
                            &local_218,true);
        if ((spv_const_context)local_208._0_8_ != (spv_const_context)0x0) {
          (*(code *)local_208._0_8_)(&local_218,&local_218,3);
        }
        if (bVar11) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_2b8,_,0x1b0c,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,
                     "Cannot store to OpTypeImage, OpTypeSampler, OpTypeSampledImage, or OpTypeAccelerationStructureKHR objects"
                     ,0x69);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
          sVar23 = local_208._448_4_;
        }
        sVar15 = sVar23;
        if (bVar11) break;
      }
      goto LAB_00692e1b;
    }
    ValidationState_t::diag
              ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218._M_pod_data,"OpStore Object <id> ",0x14);
    ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,uVar14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
               local_2b8._M_string_length);
    pcVar39 = " is not an object.";
    lVar35 = 0x12;
LAB_00694055:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218._M_pod_data,pcVar39,lVar35);
LAB_0069406c:
    uVar40 = local_2b8.field_2._M_allocated_capacity;
    uVar43 = local_2b8._M_dataplus._M_p;
    sVar16 = local_208._448_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p == &local_2b8.field_2) goto LAB_00692ac5;
LAB_00692ab5:
    operator_delete((void *)uVar43,uVar40 + 1);
    local_208._448_4_ = sVar16;
LAB_00692ac5:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
    sVar15 = local_208._448_4_;
    break;
  case 0x3f:
  case 0x40:
    uVar17 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,0);
    pIVar24 = ValidationState_t::FindDef(_,uVar17);
    if (pIVar24 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Target operand <id> ",0x14);
LAB_00692115:
      p_Var29 = &local_218;
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)p_Var29->_M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
      pcVar39 = " is not defined.";
      lVar35 = 0x10;
      goto LAB_00692a94;
    }
    uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,1);
    pIVar27 = ValidationState_t::FindDef(_,uVar14);
    if (pIVar27 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Source operand <id> ",0x14);
      uVar17 = uVar14;
      goto LAB_00692115;
    }
    pIVar24 = ValidationState_t::FindDef(_,(pIVar24->inst_).type_id);
    if ((pIVar24 == (Instruction *)0x0) ||
       ((uVar3 = (pIVar24->inst_).opcode, uVar3 != 0x20 && (uVar3 != 0x1141)))) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Target operand <id> ",0x14);
LAB_00692863:
      p_Var29 = &local_218;
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)p_Var29->_M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_);
      pcVar39 = " is not a pointer.";
      lVar35 = 0x12;
      goto LAB_00692a94;
    }
    pIVar27 = ValidationState_t::FindDef(_,(pIVar27->inst_).type_id);
    if ((pIVar27 == (Instruction *)0x0) ||
       ((uVar3 = (pIVar27->inst_).opcode, uVar3 != 0x20 && (uVar3 != 0x1141)))) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Source operand <id> ",0x14);
      uVar17 = uVar14;
      goto LAB_00692863;
    }
    local_288 = pIVar24;
    if (*(short *)((long)&(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_start + 2) == 0x3f) {
      if ((pIVar24->inst_).opcode == 0x20) {
        uVar18 = Instruction::GetOperandAs<unsigned_int>(pIVar24,2);
        pIVar24 = ValidationState_t::FindDef(_,uVar18);
        if ((pIVar24 != (Instruction *)0x0) && ((pIVar24->inst_).opcode != 0x13)) goto LAB_00694082;
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"Target operand <id> ",0x14);
        uVar14 = uVar17;
LAB_006940f7:
        ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar14);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                   local_2d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data," cannot be a void pointer.",0x1a);
        sVar16 = local_208._448_4_;
LAB_00694131:
        if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
          operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
        }
LAB_0069414b:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
        bVar11 = false;
      }
      else {
        pIVar24 = (Instruction *)0x0;
LAB_00694082:
        if (uVar3 == 0x20) {
          uVar18 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
          pIVar27 = ValidationState_t::FindDef(_,uVar18);
          if ((pIVar27 == (Instruction *)0x0) || ((pIVar27->inst_).opcode == 0x13)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"Source operand <id> ",0x14);
            goto LAB_006940f7;
          }
        }
        else {
          pIVar27 = (Instruction *)0x0;
        }
        if (((pIVar24 != (Instruction *)0x0) && (pIVar27 != (Instruction *)0x0)) &&
           ((pIVar24->inst_).result_id != (pIVar27->inst_).result_id)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"Target <id> ",0xc);
          ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                     local_2d8._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"s type does not match Source <id> ",0x22);
          ValidationState_t::getIdName_abi_cxx11_(&local_2b8,_,(pIVar27->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                     local_2b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,"s type.",7);
          sVar16 = local_208._448_4_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00694131;
        }
        if (pIVar24 == (Instruction *)0x0 && pIVar27 == (Instruction *)0x0) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,
                     "One of Source or Target must be a typed pointer",0x2f);
          sVar16 = local_208._448_4_;
          goto LAB_0069414b;
        }
        sVar16 = anon_unknown_2::CheckMemoryAccess(_,inst,2);
        bVar11 = sVar16 == SPV_SUCCESS;
      }
      sVar15 = sVar16;
      if (!bVar11) break;
      goto LAB_00694e74;
    }
    uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
    pIVar24 = ValidationState_t::FindDef(_,uVar14);
    if (pIVar24 == (Instruction *)0x0) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_((string *)&local_2d8,_,uVar14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_)
      ;
      pcVar39 = " is not defined.";
      lVar35 = 0x10;
LAB_00694e33:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar39,lVar35);
      sVar16 = local_208._448_4_;
      if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
        operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
      goto LAB_00694e6a;
    }
    local_298 = (Instruction *)CONCAT44(local_298._4_4_,uVar14);
    pIVar28 = ValidationState_t::FindDef(_,(pIVar24->inst_).type_id);
    bVar11 = ValidationState_t::IsIntScalarType(_,(pIVar28->inst_).result_id);
    if (!bVar11) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)&local_2d8,_,(TensorAddressingOperandsMask)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_)
      ;
      pcVar39 = " must be a scalar integer type.";
      lVar35 = 0x1f;
      goto LAB_00694e33;
    }
    uVar3 = (pIVar24->inst_).opcode;
    if (uVar3 == 0x2b) {
      if (((pIVar28->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start[3] != 1) ||
         (-1 < (int)(pIVar24->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1])) {
        puVar6 = (pIVar24->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar32 = (long)(pIVar24->words_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar6 >> 2;
        uVar36 = 3;
        if (3 < uVar32) {
          do {
            if (puVar6[uVar36] != 0) goto LAB_00693151;
            uVar36 = uVar36 + 1;
          } while (uVar32 != uVar36);
        }
        goto LAB_00694dce;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)&local_2d8,_,(TensorAddressingOperandsMask)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data," cannot have the sign bit set to 1.",0x23);
      sVar16 = local_208._448_4_;
      if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
        operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
      bVar11 = false;
      goto LAB_00694e6c;
    }
    if (uVar3 == 0x2e) {
LAB_00694dce:
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Size operand <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_
                ((string *)&local_2d8,_,(TensorAddressingOperandsMask)local_298);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_)
      ;
      pcVar39 = " cannot be a constant zero.";
      lVar35 = 0x1b;
      goto LAB_00694e33;
    }
LAB_00693151:
    pIVar24 = (Instruction *)&_->module_capabilities_;
    bVar11 = EnumSet<spv::Capability>::contains
                       ((EnumSet<spv::Capability> *)pIVar24,CapabilityShader);
    if (!bVar11) goto LAB_00695ca6;
    ValidationState_t::EvalInt32IfConst
              ((tuple<bool,_bool,_unsigned_int> *)&local_218,_,
               (TensorAddressingOperandsMask)local_298);
    local_290 = local_218._0_4_;
    bVar11 = true;
    if (((local_218._M_unused._M_member_pointer & 3) != 0 & local_218._M_pod_data[4]) != 1)
    goto LAB_00695c99;
    local_298 = (Instruction *)inst;
    SVar22 = Instruction::GetOperandAs<spv::StorageClass>(pIVar27,1);
    local_238 = CONCAT44(extraout_var_00,SVar22);
    SVar22 = Instruction::GetOperandAs<spv::StorageClass>(local_288,1);
    local_230 = CONCAT44(extraout_var_01,SVar22);
    bVar11 = EnumSet<spv::Capability>::contains((EnumSet<spv::Capability> *)pIVar24,CapabilityInt8);
    local_28c = CONCAT31(local_28c._1_3_,bVar11);
    bVar11 = EnumSet<spv::Capability>::contains
                       ((EnumSet<spv::Capability> *)pIVar24,
                        CapabilityUniformAndStorageBuffer8BitAccess);
    bVar7 = EnumSet<spv::Capability>::contains
                      ((EnumSet<spv::Capability> *)pIVar24,CapabilityStorageBuffer8BitAccess);
    bVar8 = EnumSet<spv::Capability>::contains
                      ((EnumSet<spv::Capability> *)pIVar24,CapabilityStoragePushConstant8);
    bVar9 = EnumSet<spv::Capability>::contains
                      ((EnumSet<spv::Capability> *)pIVar24,
                       CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR);
    local_25c = bVar9;
    bVar9 = EnumSet<spv::Capability>::contains((EnumSet<spv::Capability> *)pIVar24,CapabilityInt16);
    local_24c = CONCAT31(local_24c._1_3_,bVar9);
    bVar9 = EnumSet<spv::Capability>::contains
                      ((EnumSet<spv::Capability> *)pIVar24,CapabilityStorageUniform16);
    local_240 = CONCAT71(local_240._1_7_,bVar11);
    pIVar27 = (Instruction *)(ulong)(bVar11 || bVar9);
    bVar10 = EnumSet<spv::Capability>::contains
                       ((EnumSet<spv::Capability> *)pIVar24,CapabilityStorageBuffer16BitAccess);
    uVar32 = CONCAT71(extraout_var,bVar10) & 0xffffffff;
    local_250 = CONCAT31(local_250._1_3_,bVar7 || bVar11);
    pIVar28 = (Instruction *)CONCAT71((int7)(uVar32 >> 8),(byte)uVar32 | bVar9 | (bVar7 || bVar11));
    bVar7 = EnumSet<spv::Capability>::contains
                      ((EnumSet<spv::Capability> *)pIVar24,CapabilityStoragePushConstant16);
    bVar9 = EnumSet<spv::Capability>::contains
                      ((EnumSet<spv::Capability> *)pIVar24,CapabilityStorageInputOutput16);
    bVar10 = EnumSet<spv::Capability>::contains
                       ((EnumSet<spv::Capability> *)pIVar24,
                        CapabilityWorkgroupMemoryExplicitLayout16BitAccessKHR);
    inst = (Instruction *)local_298;
    bVar11 = false;
    bVar33 = 0;
    switch((int)local_238) {
    case 1:
    case 3:
      bVar33 = 0;
      bVar11 = bVar9;
      break;
    case 2:
      pIVar24 = pIVar27;
      bVar33 = (byte)local_240;
      goto LAB_00695b18;
    case 4:
      pIVar24 = (Instruction *)(ulong)bVar10;
      bVar33 = local_25c;
      goto LAB_00695b18;
    case 5:
    case 6:
    case 7:
    case 8:
    case 10:
    case 0xb:
      break;
    case 9:
      bVar11 = bVar7 || bVar8;
      bVar33 = bVar8;
      break;
    case 0xc:
      pIVar24 = pIVar28;
      bVar33 = (byte)local_250;
LAB_00695b18:
      bVar11 = SUB81(pIVar24,0);
      break;
    default:
      bVar33 = 0;
    }
    bVar38 = false;
    bVar42 = 0;
    switch((int)local_230) {
    case 2:
      bVar42 = (byte)local_240;
      goto LAB_00695bf9;
    case 3:
      bVar42 = 0;
      bVar38 = bVar9;
      break;
    case 4:
      pIVar27 = (Instruction *)(ulong)bVar10;
      bVar42 = local_25c;
      goto LAB_00695bf9;
    case 5:
    case 6:
    case 7:
    case 8:
    case 10:
    case 0xb:
      break;
    case 9:
      bVar38 = bVar7 || bVar8;
      bVar42 = bVar8;
      break;
    case 0xc:
      pIVar27 = pIVar28;
      bVar42 = (byte)local_250;
LAB_00695bf9:
      bVar38 = SUB81(pIVar27,0);
      break;
    default:
      bVar42 = 0;
    }
    if (((char)local_24c == '\0' && (bVar11 & bVar38) == 0) && (char)local_28c == '\0') {
      ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,local_298);
      pcVar39 = "Size must be a multiple of 4";
LAB_00695c7b:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar39,0x1c);
      pIVar24 = (Instruction *)(ulong)(uint)local_208._448_4_;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
      bVar11 = false;
    }
    else {
      bVar11 = true;
      pIVar24 = pIVar28;
      if (((char)local_28c == '\0' && (bVar33 & bVar42) == 0) && (local_290 & 1) != 0) {
        ValidationState_t::diag((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,local_298);
        pcVar39 = "Size must be a multiple of 2";
        goto LAB_00695c7b;
      }
    }
LAB_00695c99:
    sVar16 = (spv_result_t)pIVar24;
    pIVar28 = pIVar24;
    if (bVar11) {
LAB_00695ca6:
      sVar15 = anon_unknown_2::CheckMemoryAccess(_,inst,3);
      bVar11 = sVar15 == SPV_SUCCESS;
      sVar16 = (spv_result_t)pIVar28;
      if (!bVar11) {
        sVar16 = sVar15;
      }
    }
    else {
LAB_00694e6a:
      bVar11 = false;
    }
LAB_00694e6c:
    sVar15 = sVar16;
    if (bVar11) {
LAB_00694e74:
      pIVar24 = local_288;
      uVar2 = (((Instruction *)inst)->inst_).opcode;
      if (1 < uVar2 - 0x3f) {
        __assert_fail("inst->opcode() == spv::Op::OpCopyMemory || inst->opcode() == spv::Op::OpCopyMemorySized"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_memory.cpp"
                      ,0x48c,
                      "spv_result_t spvtools::val::(anonymous namespace)::ValidateCopyMemoryMemoryAccess(ValidationState_t &, const Instruction *)"
                     );
      }
      uVar14 = uVar2 == 0x3f ^ 3;
      if ((ulong)uVar14 <
          (ulong)((long)(((Instruction *)inst)->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(((Instruction *)inst)->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        sVar15 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar14);
        if (sVar15 == SPV_SUCCESS) {
          uVar18 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)uVar14);
          uVar14 = (((uVar18 >> 3 & 1) + uVar14 + (uint)((uVar18 >> 4 & 1) != 0)) -
                   (uint)((uVar18 & 2) == 0)) + 2;
          bVar11 = true;
          if ((ulong)uVar14 <
              (ulong)((long)(((Instruction *)inst)->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(((Instruction *)inst)->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4)) {
            if ((_->features_).copy_memory_permits_two_memory_accesses == true) {
              sVar23 = anon_unknown_2::CheckMemoryAccess(_,inst,uVar14);
              if (sVar23 == SPV_SUCCESS) {
                if ((uVar18 & 0x10) == 0) {
                  uVar14 = Instruction::GetOperandAs<unsigned_int>
                                     ((Instruction *)inst,(ulong)uVar14);
                  bVar11 = (uVar14 & 8) == 0;
                  if (bVar11) goto LAB_00695a2d;
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                             (Instruction *)inst);
                  pcVar39 = "Source memory access must not include MakePointerAvailableKHR";
                  lVar35 = 0x3d;
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,
                             (Instruction *)inst);
                  pcVar39 = "Target memory access must not include MakePointerVisibleKHR";
                  lVar35 = 0x3b;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_218._M_pod_data,pcVar39,lVar35);
                sVar23 = local_208._448_4_;
                goto LAB_00695a23;
              }
            }
            else {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst
                        );
              local_2d8._M_unused._0_8_ =
                   (undefined8)spvOpcodeString((uint)(((Instruction *)inst)->inst_).opcode);
              pDVar30 = DiagnosticStream::operator<<
                                  ((DiagnosticStream *)&local_218,(char **)&local_2d8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)pDVar30,
                         " with two memory access operands requires SPIR-V 1.4 or later",0x3d);
              sVar23 = pDVar30->error_;
LAB_00695a23:
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
            }
            sVar15 = sVar23;
            bVar11 = false;
          }
LAB_00695a2d:
          pIVar24 = local_288;
          if (bVar11) goto LAB_00695a36;
        }
      }
      else {
LAB_00695a36:
        sVar15 = SPV_SUCCESS;
        pIVar24 = local_288;
      }
      if (sVar15 == SPV_SUCCESS) {
        pIVar27 = local_288;
        if ((pIVar24->inst_).opcode == 0x20) {
          do {
            uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar27,2);
            pIVar27 = ValidationState_t::FindDef(_,uVar14);
          } while ((pIVar27->inst_).opcode == 0x20);
          bVar7 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
          bVar11 = true;
          if ((bVar7) &&
             (bVar7 = ValidationState_t::ContainsLimitedUseIntOrFloatType
                                (_,(pIVar27->inst_).result_id), bVar7)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,
                       "Cannot copy memory of objects containing 8- or 16-bit types",0x3b);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
            bVar11 = false;
            sVar16 = local_208._448_4_;
          }
          sVar15 = sVar16;
          if (!bVar11) break;
        }
LAB_00692e1b:
        sVar15 = SPV_SUCCESS;
      }
    }
    break;
  case 0x41:
  case 0x42:
  case 0x46:
switchD_006909d1_caseD_41:
    sVar16 = anon_unknown_2::ValidateAccessChain(_,inst);
LAB_00690e86:
    if (sVar16 != SPV_SUCCESS) {
      return sVar16;
    }
    goto switchD_006909d1_caseD_3c;
  case 0x43:
switchD_006909d1_caseD_43:
    AVar13 = ValidationState_t::addressing_model(_);
    if (((AVar13 == AddressingModelLogical) &&
        (*(short *)((long)&(inst->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_start + 2) == 0x43)) &&
       ((_->features_).variable_pointers == false)) {
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,
                 "Generating variable pointers requires capability ",0x31);
      pcVar39 = "VariablePointers or VariablePointersStorageBuffer";
      lVar35 = 0x31;
      goto LAB_00692704;
    }
    sVar15 = anon_unknown_2::ValidateAccessChain(_,inst);
    if (sVar15 == SPV_SUCCESS) {
      bVar11 = spvOpcodeGeneratesUntypedPointer
                         ((uint)*(ushort *)
                                 ((long)&(inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 2));
      uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      pIVar24 = ValidationState_t::FindDef(_,uVar14);
      if (bVar11) {
        uVar17 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
      }
      else {
        uVar17 = (pIVar24->inst_).type_id;
      }
      pIVar24 = ValidationState_t::FindDef(_,uVar17);
      SVar22 = Instruction::GetOperandAs<spv::StorageClass>(pIVar24,1);
      this = &_->module_capabilities_;
      bVar7 = EnumSet<spv::Capability>::contains(this,CapabilityShader);
      if ((bVar7) &&
         ((((SVar22 < (StorageBuffer|Input) && ((0x1204U >> (SVar22 & 0x1f) & 1) != 0)) ||
           ((SVar22 == PhysicalStorageBuffer ||
            ((bVar7 = EnumSet<spv::Capability>::contains
                                (this,CapabilityWorkgroupMemoryExplicitLayoutKHR),
             SVar22 == StorageClassWorkgroup && (bVar7)))))) &&
          (bVar7 = ValidationState_t::HasDecoration(_,(pIVar24->inst_).result_id,ArrayStride),
          !bVar7)))) {
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
        pcVar39 = "OpPtrAccessChain must have a Base whose type is decorated with ArrayStride";
        lVar35 = 0x4a;
        goto LAB_00692704;
      }
      bVar7 = spvIsVulkanEnv(_->context_->target_env);
      if (!bVar7) goto LAB_00692e1b;
      if (bVar11) {
        bVar11 = EnumSet<spv::Capability>::contains(this,CapabilityUntypedPointersKHR);
      }
      else {
        bVar11 = false;
      }
      bVar7 = true;
      if (SVar22 != PhysicalStorageBuffer) {
        if (SVar22 == StorageBuffer) {
          if (bVar11 == false && (_->features_).variable_pointers == false) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2d8,_,0x1de4,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                       local_2d8._8_8_);
            pcVar39 = 
            "OpPtrAccessChain Base operand pointing to StorageBuffer storage class must use VariablePointers or VariablePointersStorageBuffer capability"
            ;
            lVar35 = 0x8b;
            goto LAB_00692ddb;
          }
        }
        else if (SVar22 == StorageClassWorkgroup) {
          bVar8 = EnumSet<spv::Capability>::contains(this,CapabilityVariablePointers);
          bVar7 = true;
          if (bVar11 == false && !bVar8) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2d8,_,0x1de3,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                       local_2d8._8_8_);
            pcVar39 = 
            "OpPtrAccessChain Base operand pointing to Workgroup storage class must use VariablePointers capability"
            ;
            lVar35 = 0x66;
LAB_00692ddb:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,pcVar39,lVar35);
            if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
              operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
            bVar7 = false;
            sVar15 = local_208._448_4_;
          }
        }
        else if (bVar11 == false) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_DATA,(Instruction *)inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)&local_2d8,_,0x1de2,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                     local_2d8._8_8_);
          pcVar39 = 
          "OpPtrAccessChain Base operand must point to Workgroup, StorageBuffer, or PhysicalStorageBuffer storage class"
          ;
          lVar35 = 0x6c;
          goto LAB_00692ddb;
        }
      }
      if (bVar7) goto LAB_00692e1b;
    }
    break;
  case 0x44:
switchD_006909d1_caseD_44:
    pcVar39 = spvOpcodeString(opcode);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_218._M_pod_data,pcVar39,(allocator<char> *)&local_2b8);
    plVar25 = (long *)std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,0x7c6340);
    local_2d8._M_unused._M_object = &local_2c8;
    pp_Var31 = (_Any_data **)(plVar25 + 2);
    if ((_Any_data **)*plVar25 == pp_Var31) {
      local_2c8 = *pp_Var31;
      pcStack_2c0 = (code *)plVar25[3];
    }
    else {
      local_2c8 = *pp_Var31;
      local_2d8._M_unused._M_object = (_Any_data **)*plVar25;
    }
    local_2d8._8_8_ = plVar25[1];
    *plVar25 = (long)pp_Var31;
    plVar25[1] = 0;
    *(undefined1 *)(plVar25 + 2) = 0;
    if ((ValidationState_t *)local_218._M_unused._0_8_ != (ValidationState_t *)local_208) {
      operator_delete(local_218._M_unused._M_object,(ulong)(local_208._0_8_ + 1));
    }
    pIVar24 = ValidationState_t::FindDef
                        (_,*(uint32_t *)
                            &(inst->operands_).
                             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
    if ((((pIVar24->inst_).opcode == 0x15) &&
        (uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,1), uVar14 == 0x20)) &&
       (uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,2), uVar14 == 0)) {
      sVar5 = *(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2);
      uVar17 = ValidationState_t::GetOperandTypeId
                         (_,(Instruction *)inst,(ulong)(sVar5 == 0x1149) | 2);
      pIVar24 = ValidationState_t::FindDef(_,uVar17);
      uVar3 = (pIVar24->inst_).opcode;
      if (sVar5 != 0x1149) {
        if (uVar3 == 0x20) goto LAB_00692e7c;
LAB_00692f83:
        ValidationState_t::diag
                  ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,"The Structure\'s type in ",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                   local_2d8._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data," <id> ",6);
        ValidationState_t::getIdName_abi_cxx11_
                  (&local_2b8,_,
                   *(uint32_t *)
                    ((long)&(inst->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                   local_2b8._M_string_length);
        pcVar39 = " must be a pointer to an OpTypeStruct.";
        lVar35 = 0x26;
        goto LAB_00691e48;
      }
      pIVar24 = (Instruction *)inst;
      if (uVar3 == 0x1141) {
LAB_00692e7c:
        uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,2);
        pIVar24 = ValidationState_t::FindDef(_,uVar14);
        if ((pIVar24->inst_).opcode == 0x1e) {
          lVar35 = (long)(pIVar24->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pIVar24->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
          uVar14 = Instruction::GetOperandAs<unsigned_int>(pIVar24,lVar35 - 1);
          pIVar24 = ValidationState_t::FindDef(_,uVar14);
          if ((pIVar24->inst_).opcode == 0x1d) {
            uVar14 = Instruction::GetOperandAs<unsigned_int>
                               ((Instruction *)inst,(ulong)(sVar5 == 0x1149) + 3);
            sVar15 = SPV_SUCCESS;
            if (lVar35 - 2U == (ulong)uVar14) goto LAB_00691e7e;
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The array member in ",0x14);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                       local_2d8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      (&local_2b8,_,
                       *(uint32_t *)
                        ((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                       local_2b8._M_string_length);
            pcVar39 = " must be the last member of the struct.";
            lVar35 = 0x27;
          }
          else {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,"The Structure\'s last member in ",0x1f);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,
                       local_2d8._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data," <id> ",6);
            ValidationState_t::getIdName_abi_cxx11_
                      (&local_2b8,_,
                       *(uint32_t *)
                        ((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                       local_2b8._M_string_length);
            pcVar39 = " must be an OpTypeRuntimeArray.";
            lVar35 = 0x1f;
          }
          goto LAB_00691e48;
        }
        goto LAB_00692f83;
      }
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"Pointer must be an untyped pointer",0x22);
      sVar15 = local_208._448_4_;
    }
    else {
LAB_00691dc4:
      ValidationState_t::diag
                ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,"The Result Type of ",0x13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,(char *)local_2d8._M_unused._0_8_,local_2d8._8_8_)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data," <id> ",6);
      ValidationState_t::getIdName_abi_cxx11_
                (&local_2b8,_,
                 *(uint32_t *)
                  ((long)&(inst->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,local_2b8._M_dataplus._M_p,
                 local_2b8._M_string_length);
      pcVar39 = " must be OpTypeInt with width 32 and signedness 0.";
      lVar35 = 0x32;
LAB_00691e48:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218._M_pod_data,pcVar39,lVar35);
      sVar15 = local_208._448_4_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
    }
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
LAB_00691e7e:
    if ((_Any_data **)local_2d8._M_unused._0_8_ != &local_2c8) {
LAB_00692bba:
      operator_delete(local_2d8._M_unused._M_object,(long)local_2c8 + 1);
    }
    break;
  default:
    switch(uVar2) {
    case 0x1142:
      goto switchD_006909d1_caseD_3b;
    case 0x1143:
    case 0x1144:
      goto switchD_006909d1_caseD_41;
    case 0x1145:
    case 0x1146:
      break;
    case 0x1147:
    case 0x1148:
      goto switchD_006909d1_caseD_43;
    case 0x1149:
      goto switchD_006909d1_caseD_44;
    default:
      if (opcode - OpPtrEqual < 3) {
        AVar13 = ValidationState_t::addressing_model(_);
        if ((AVar13 == AddressingModelLogical) && ((_->features_).variable_pointers == false)) {
          ValidationState_t::diag
                    ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
          pcVar39 = 
          "Instruction cannot for logical addressing model be used without a variable pointers capability"
          ;
          lVar35 = 0x5e;
        }
        else {
          pIVar24 = ValidationState_t::FindDef
                              (_,*(uint32_t *)
                                  &(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
          if (*(short *)((long)&(inst->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start + 2) == 0x193) {
            if ((pIVar24 == (Instruction *)0x0) || ((pIVar24->inst_).opcode != 0x15)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
              pcVar39 = "Result Type must be an integer scalar";
              lVar35 = 0x25;
            }
            else {
LAB_00690fa6:
              uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,2);
              pIVar24 = ValidationState_t::FindDef(_,uVar14);
              uVar14 = Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,3);
              pIVar27 = ValidationState_t::FindDef(_,uVar14);
              pIVar28 = ValidationState_t::FindDef(_,(pIVar24->inst_).type_id);
              this_00 = ValidationState_t::FindDef(_,(pIVar27->inst_).type_id);
              if (((pIVar28 == (Instruction *)0x0) ||
                  (((uVar3 = (pIVar28->inst_).opcode, uVar3 != 0x20 && (uVar3 != 0x1141)) ||
                   (this_00 == (Instruction *)0x0)))) ||
                 ((uVar4 = (this_00->inst_).opcode, uVar4 != 0x20 && (uVar4 != 0x1141)))) {
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                pcVar39 = "Operand type must be a pointer";
                goto LAB_00691eb3;
              }
              if (*(short *)((long)&(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 2) == 0x193) {
                if ((pIVar24->inst_).type_id != (pIVar27->inst_).type_id) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  pcVar39 = "The types of Operand 1 and Operand 2 must match";
                  lVar35 = 0x2f;
                  goto LAB_00692704;
                }
              }
              else {
                if ((uVar3 == 0x1141) || (uVar4 == 0x1141)) {
                  SVar22 = Instruction::GetOperandAs<spv::StorageClass>(pIVar28,1);
                  SVar20 = Instruction::GetOperandAs<spv::StorageClass>(this_00,1);
                  bVar11 = SVar22 == SVar20;
                  if (!bVar11) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                               (Instruction *)inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_218._M_pod_data,"Pointer storage classes must match"
                               ,0x22);
                    goto LAB_00694856;
                  }
                }
                else if ((pIVar24->inst_).type_id == (pIVar27->inst_).type_id) {
                  bVar11 = true;
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_218._M_pod_data,
                             "The types of Operand 1 and Operand 2 must match",0x2f);
LAB_00694856:
                  pIVar24 = (Instruction *)(ulong)(uint)local_208._448_4_;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_218);
                  bVar11 = false;
                }
                sVar15 = (spv_result_t)pIVar24;
                if (!bVar11) goto LAB_00692aca;
              }
              SVar22 = Instruction::GetOperandAs<spv::StorageClass>(pIVar28,1);
              AVar13 = ValidationState_t::addressing_model(_);
              if (AVar13 == AddressingModelLogical) {
                if ((SVar22 & ~Generic) == StorageClassWorkgroup) {
                  sVar15 = SPV_SUCCESS;
                  if ((SVar22 != StorageClassWorkgroup) ||
                     (bVar11 = EnumSet<spv::Capability>::contains
                                         (&_->module_capabilities_,CapabilityVariablePointers),
                     sVar15 = SPV_SUCCESS, bVar11)) goto LAB_00692aca;
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  pcVar39 = 
                  "Workgroup storage class pointer requires VariablePointers capability to be specified"
                  ;
                  lVar35 = 0x54;
                }
                else {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,
                             (Instruction *)inst);
                  pcVar39 = "Invalid pointer storage class";
                  lVar35 = 0x1d;
                }
              }
              else {
                sVar15 = SPV_SUCCESS;
                if (SVar22 != PhysicalStorageBuffer) goto LAB_00692aca;
                ValidationState_t::diag
                          ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst
                          );
                pcVar39 = "Cannot use a pointer in the PhysicalStorageBuffer storage class";
                lVar35 = 0x3f;
              }
            }
          }
          else {
            if ((pIVar24 != (Instruction *)0x0) && ((pIVar24->inst_).opcode == 0x14))
            goto LAB_00690fa6;
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_218,_,SPV_ERROR_INVALID_ID,(Instruction *)inst);
            pcVar39 = "Result Type must be OpTypeBool";
LAB_00691eb3:
            lVar35 = 0x1e;
          }
        }
        goto LAB_00692704;
      }
    }
    goto switchD_006909d1_caseD_3c;
  }
LAB_00692aca:
  if (sVar15 == SPV_SUCCESS) {
switchD_006909d1_caseD_3c:
    sVar15 = SPV_SUCCESS;
  }
  return sVar15;
}

Assistant:

spv_result_t MemoryPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpVariable:
    case spv::Op::OpUntypedVariableKHR:
      if (auto error = ValidateVariable(_, inst)) return error;
      break;
    case spv::Op::OpLoad:
      if (auto error = ValidateLoad(_, inst)) return error;
      break;
    case spv::Op::OpStore:
      if (auto error = ValidateStore(_, inst)) return error;
      break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      if (auto error = ValidateCopyMemory(_, inst)) return error;
      break;
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpUntypedPtrAccessChainKHR:
    case spv::Op::OpUntypedInBoundsPtrAccessChainKHR:
      if (auto error = ValidatePtrAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
    case spv::Op::OpUntypedAccessChainKHR:
    case spv::Op::OpUntypedInBoundsAccessChainKHR:
      if (auto error = ValidateAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpRawAccessChainNV:
      if (auto error = ValidateRawAccessChain(_, inst)) return error;
      break;
    case spv::Op::OpArrayLength:
    case spv::Op::OpUntypedArrayLengthKHR:
      if (auto error = ValidateArrayLength(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadNV:
    case spv::Op::OpCooperativeMatrixStoreNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLengthKHR:
    case spv::Op::OpCooperativeMatrixLengthNV:
      if (auto error = ValidateCooperativeMatrixLengthNV(_, inst)) return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadKHR:
    case spv::Op::OpCooperativeMatrixStoreKHR:
      if (auto error = ValidateCooperativeMatrixLoadStoreKHR(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeMatrixLoadTensorNV:
    case spv::Op::OpCooperativeMatrixStoreTensorNV:
      if (auto error = ValidateCooperativeMatrixLoadStoreTensorNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorLoadNV:
    case spv::Op::OpCooperativeVectorStoreNV:
      if (auto error = ValidateCooperativeVectorLoadStoreNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorOuterProductAccumulateNV:
      if (auto error = ValidateCooperativeVectorOuterProductNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorReduceSumAccumulateNV:
      if (auto error = ValidateCooperativeVectorReduceSumNV(_, inst))
        return error;
      break;
    case spv::Op::OpCooperativeVectorMatrixMulNV:
    case spv::Op::OpCooperativeVectorMatrixMulAddNV:
      if (auto error = ValidateCooperativeVectorMatrixMulNV(_, inst))
        return error;
      break;
    case spv::Op::OpPtrEqual:
    case spv::Op::OpPtrNotEqual:
    case spv::Op::OpPtrDiff:
      if (auto error = ValidatePtrComparison(_, inst)) return error;
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpGenericPtrMemSemantics:
    default:
      break;
  }

  return SPV_SUCCESS;
}